

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateObjectAPITableExtension
          (SwiftGenerator *this,StructDef *struct_def)

{
  Value *type_00;
  BaseType BVar1;
  int iVar2;
  FieldDef *field_def;
  SwiftGenerator *pSVar3;
  CodeWriter *this_00;
  IdlNamer *pIVar4;
  StructDef *pSVar5;
  pointer ppFVar6;
  pointer pbVar7;
  char *__s;
  string *__return_storage_ptr__;
  string code;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unpack_body;
  string field_var;
  string body;
  string builder;
  string field_field;
  string type;
  string field_method;
  string check_if_vector;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  SwiftGenerator *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  CodeWriter *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  StructDef *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  IdlNamer *local_1e0;
  pointer local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_248 = struct_def;
  IdlNamer::NamespacedObjectType_abi_cxx11_(&local_d0,&this->namer_,&struct_def->super_Definition);
  GenerateObjectAPIExtensionHeader(this,&local_d0);
  local_1e0 = &this->namer_;
  std::__cxx11::string::~string((string *)&local_d0);
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,", &builder)",(allocator<char> *)&local_288);
  ppFVar6 = (local_248->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_290 = &this->code_;
  pSVar5 = local_248;
  local_2d0 = this;
  do {
    pIVar4 = local_1e0;
    if (ppFVar6 ==
        (pSVar5->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,
                 "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)",
                 (allocator<char> *)&local_288);
      this_00 = local_290;
      CodeWriter::operator+=(local_290,&local_170);
      pSVar3 = local_2d0;
      std::__cxx11::string::~string((string *)&local_170);
      for (pbVar7 = local_2a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 < local_2a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::string((string *)&local_b0,(string *)pbVar7);
        CodeWriter::operator+=(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,
                 "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: __root)",
                 (allocator<char> *)&local_288);
      CodeWriter::operator+=(this_00,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      iVar2 = (pSVar3->code_).cur_ident_lvl_;
      if (iVar2 != 0) {
        (pSVar3->code_).cur_ident_lvl_ = iVar2 + -1;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"}",(allocator<char> *)&local_288);
      CodeWriter::operator+=(this_00,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a8);
      return;
    }
    field_def = *ppFVar6;
    if (field_def->deprecated == false) {
      local_1d8 = ppFVar6;
      (*(local_1e0->super_Namer)._vptr_Namer[7])(&local_288,local_1e0,field_def);
      (*(pIVar4->super_Namer)._vptr_Namer[0x12])(&local_1d0,pIVar4,field_def);
      (*(pIVar4->super_Namer)._vptr_Namer[4])(&local_110,pIVar4,field_def);
      type_00 = &field_def->value;
      GenType_abi_cxx11_(&local_130,local_2d0,&type_00->type,false);
      BVar1 = (type_00->type).base_type;
      __s = "VectorOf(";
      if (((BVar1 != BASE_TYPE_VECTOR) && (__s = "VectorOf(", BVar1 != BASE_TYPE_VECTOR64)) &&
         (__s = "(", BVar1 == BASE_TYPE_ARRAY)) {
        __s = "VectorOf(";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,__s,(allocator<char> *)&local_240);
      std::operator+(&local_268,"add",&local_f0);
      std::operator+(&local_2c8,&local_268,&local_110);
      std::operator+(&local_240,&local_2c8,": ");
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_268);
      BVar1 = (type_00->type).base_type;
      if (BVar1 - BASE_TYPE_STRING < 5) {
        __return_storage_ptr__ = &local_2c8;
        switch(BVar1) {
        case BASE_TYPE_STRING:
          std::operator+(&local_200,"{{STRUCTNAME}}.",&local_240);
          std::operator+(&local_2f0,&local_200,"__");
          std::operator+(&local_268,&local_2f0,&local_288);
          std::operator+(__return_storage_ptr__,&local_268,&local_220);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_200);
          if (field_def->presence == kRequired) {
            std::operator+(&local_2f0,"let __",&local_288);
            std::operator+(&local_268,&local_2f0," = builder.create(string: obj.");
            std::operator+(__return_storage_ptr__,&local_268,&local_1d0);
            std::operator+(&local_90,__return_storage_ptr__,")");
            CodeWriter::operator+=(local_290,&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_268);
            __return_storage_ptr__ = &local_2f0;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)__return_storage_ptr__,"builder.create(string: s)",
                       (allocator<char> *)&local_268);
            BuildingOptionalObjects(local_2d0,&local_1d0,__return_storage_ptr__);
          }
          break;
        default:
          GenerateVectorObjectAPITableExtension(local_2d0,field_def);
          std::operator+(&local_200,"{{STRUCTNAME}}.",&local_240);
          std::operator+(&local_2f0,&local_200,"__");
          std::operator+(&local_268,&local_2f0,&local_288);
          std::operator+(__return_storage_ptr__,&local_268,&local_220);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
LAB_0021a0c3:
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          __return_storage_ptr__ = &local_200;
          break;
        case BASE_TYPE_STRUCT:
          pSVar5 = (field_def->value).type.struct_def;
          if ((pSVar5 == (StructDef *)0x0) || (pSVar5->fixed != true)) {
            std::operator+(&local_150,"let __",&local_288);
            std::operator+(&local_200,&local_150," = ");
            std::operator+(&local_2f0,&local_200,&local_130);
            std::operator+(&local_268,&local_2f0,".pack(&builder, obj: &obj.");
            std::operator+(&local_2c8,&local_268,&local_1d0);
            std::operator+(&local_70,&local_2c8,")");
            CodeWriter::operator+=(local_290,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_2f0);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_150);
            std::operator+(&local_200,"{{STRUCTNAME}}.",&local_240);
            std::operator+(&local_2f0,&local_200,"__");
            std::operator+(&local_268,&local_2f0,&local_288);
            std::operator+(&local_2c8,&local_268,&local_220);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_2a8,&local_2c8);
            goto LAB_0021a0c3;
          }
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"",(allocator<char> *)&local_150);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f1);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"$0",&local_2f2);
          __return_storage_ptr__ = &local_2c8;
          GenerateStructArgs(local_2d0,pSVar5,__return_storage_ptr__,&local_268,&local_2f0,
                             &local_200,true);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::substr((ulong)&local_268,(ulong)__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::operator+(&local_150,"{{STRUCTNAME}}.",&local_240);
          std::operator+(&local_200,&local_150,"obj.");
          std::operator+(&local_2f0,&local_200,&local_1d0);
          std::operator+(&local_268,&local_2f0,&local_220);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,&local_268);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::~string((string *)&local_150);
          break;
        case BASE_TYPE_UNION:
          std::operator+(&local_2f0,"let __",&local_288);
          std::operator+(&local_268,&local_2f0," = obj.");
          std::operator+(__return_storage_ptr__,&local_268,&local_288);
          std::operator+(&local_50,__return_storage_ptr__,"?.pack(builder: &builder) ?? Offset()");
          CodeWriter::operator+=(local_290,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::operator+(&local_268,"if let o = obj.",&local_288);
          std::operator+(__return_storage_ptr__,&local_268,"?.type {");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_268);
          std::operator+(&local_2f0,"  {{STRUCTNAME}}.add(",&local_288);
          std::operator+(&local_268,&local_2f0,"Type: o");
          std::operator+(__return_storage_ptr__,&local_268,&local_220);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::operator+(&local_200,"  {{STRUCTNAME}}.",&local_240);
          std::operator+(&local_2f0,&local_200,"__");
          std::operator+(&local_268,&local_2f0,&local_288);
          std::operator+(__return_storage_ptr__,&local_268,&local_220);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
          std::__cxx11::string::~string((string *)__return_storage_ptr__);
          std::__cxx11::string::~string((string *)&local_268);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&local_200);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"}\n",(allocator<char> *)&local_268);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8
                     ,__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      else if (BVar1 != BASE_TYPE_UTYPE) {
        std::operator+(&local_200,"{{STRUCTNAME}}.",&local_240);
        std::operator+(&local_2f0,&local_200,"obj.");
        std::operator+(&local_268,&local_2f0,&local_1d0);
        std::operator+(&local_2c8,&local_268,&local_220);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2a8,
                   &local_2c8);
        goto LAB_0021a0c3;
      }
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_288);
      pSVar5 = local_248;
      ppFVar6 = local_1d8;
    }
    ppFVar6 = ppFVar6 + 1;
  } while( true );
}

Assistant:

void GenerateObjectAPITableExtension(const StructDef &struct_def) {
    GenerateObjectAPIExtensionHeader(namer_.NamespacedObjectType(struct_def));
    std::vector<std::string> unpack_body;
    std::string builder = ", &builder)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto field_var = namer_.Variable(field);
      const auto field_field = namer_.Field(field);
      const auto field_method = namer_.Method(field);
      const auto type = GenType(field.value.type);
      std::string check_if_vector =
          (IsVector(field.value.type) || IsArray(field.value.type))
              ? "VectorOf("
              : "(";
      std::string body = "add" + check_if_vector + field_method + ": ";
      switch (field.value.type.base_type) {
        case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();
        case BASE_TYPE_VECTOR: {
          GenerateVectorObjectAPITableExtension(field);
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          break;
        }
        case BASE_TYPE_UNION: {
          code_ += "let __" + field_var + " = obj." + field_var +
                   "?.pack(builder: &builder) ?? Offset()";
          unpack_body.push_back("if let o = obj." + field_var + "?.type {");
          unpack_body.push_back("  {{STRUCTNAME}}.add(" + field_var +
                                "Type: o" + builder);
          unpack_body.push_back("  {{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          unpack_body.push_back("}\n");
          break;
        }
        case BASE_TYPE_STRUCT: {
          if (field.value.type.struct_def &&
              field.value.type.struct_def->fixed) {
            // This is a Struct (IsStruct), not a table. We create
            // a native swift object in this case.
            std::string code;
            GenerateStructArgs(*field.value.type.struct_def, &code, "", "",
                               "$0", true);
            code = code.substr(0, code.size() - 2);
            unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                  field_field + builder);
          } else {
            code_ += "let __" + field_var + " = " + type +
                     ".pack(&builder, obj: &obj." + field_field + ")";
            unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                  builder);
          }
          break;
        }
        case BASE_TYPE_STRING: {
          unpack_body.push_back("{{STRUCTNAME}}." + body + "__" + field_var +
                                builder);
          if (field.IsRequired()) {
            code_ += "let __" + field_var + " = builder.create(string: obj." +
                     field_field + ")";
          } else {
            BuildingOptionalObjects(field_field, "builder.create(string: s)");
          }
          break;
        }
        case BASE_TYPE_UTYPE: break;
        default:
          unpack_body.push_back("{{STRUCTNAME}}." + body + "obj." +
                                field_field + builder);
      }
    }
    code_ += "let __root = {{STRUCTNAME}}.start{{SHORT_STRUCTNAME}}(&builder)";
    for (auto it = unpack_body.begin(); it < unpack_body.end(); it++)
      code_ += *it;
    code_ +=
        "return {{STRUCTNAME}}.end{{SHORT_STRUCTNAME}}(&builder, start: "
        "__root)";
    Outdent();
    code_ += "}";
  }